

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicStruct::Builder::set
          (Builder *this,StringPtr name,initializer_list<capnp::DynamicValue::Reader> value)

{
  Reader *other;
  uint index;
  long lVar1;
  Reader element;
  BuilderFor<capnp::DynamicList> list;
  Reader RStack_a8;
  BuilderFor<DynamicList> local_60;
  
  other = value._M_array;
  init((Builder *)&RStack_a8,(EVP_PKEY_CTX *)this);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_60,(Builder *)&RStack_a8);
  DynamicValue::Builder::~Builder((Builder *)&RStack_a8);
  index = 0;
  for (lVar1 = value._M_len * 0x48; lVar1 != 0; lVar1 = lVar1 + -0x48) {
    DynamicValue::Reader::Reader(&RStack_a8,other);
    DynamicList::Builder::set(&local_60,index,&RStack_a8);
    index = index + 1;
    DynamicValue::Reader::~Reader(&RStack_a8);
    other = other + 1;
  }
  return;
}

Assistant:

void DynamicStruct::Builder::set(kj::StringPtr name,
                                 std::initializer_list<DynamicValue::Reader> value) {
  auto list = init(name, value.size()).as<DynamicList>();
  uint i = 0;
  for (auto element: value) {
    list.set(i++, element);
  }
}